

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataGroup.cpp
# Opt level: O2

Data * __thiscall DL::DataGroup::at(Data *__return_storage_ptr__,DataGroup *this,size_t i)

{
  element_type *peVar1;
  reference pvVar2;
  allocator local_31;
  string_t local_30;
  
  peVar1 = (this->mShared).super___shared_ptr<DL::DataInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    if (i < (ulong)(((long)*(pointer *)
                            ((long)&(peVar1->AnonymousData).
                                    super__Vector_base<DL::Data,_std::allocator<DL::Data>_>._M_impl.
                                    super__Vector_impl_data + 8) -
                    (long)(peVar1->AnonymousData).
                          super__Vector_base<DL::Data,_std::allocator<DL::Data>_>._M_impl.
                          super__Vector_impl_data._M_start) / 0x60)) {
      pvVar2 = std::vector<DL::Data,_std::allocator<DL::Data>_>::at(&peVar1->AnonymousData,i);
      Data::Data(__return_storage_ptr__,pvVar2);
    }
    else {
      std::__cxx11::string::string((string *)&local_30,"",&local_31);
      Data::Data(__return_storage_ptr__,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("(mShared)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/PearCoding[P]DataLisp/src/DataGroup.cpp"
                ,0x72,"Data DL::DataGroup::at(size_t) const");
}

Assistant:

Data DataGroup::at(size_t i) const
{
	DL_ASSERT(mShared);

	if (i < mShared->AnonymousData.size())
		return mShared->AnonymousData.at(i);
	else
		return Data();
}